

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O0

void rungame(nh_bool tutorial)

{
  nh_bool nVar1;
  char cVar2;
  int __fd;
  size_t sVar3;
  time_t tVar4;
  int local_750;
  long t;
  fnchar savedir [256];
  fnchar filename [1024];
  char plname [256];
  char nameprompt [128];
  char chardesc [128];
  int local_20;
  int fd;
  int align;
  int gend;
  int race;
  int role;
  int ret;
  nh_bool tutorial_local;
  
  gend = initrole;
  align = initrace;
  fd = initgend;
  local_20 = initalign;
  role._3_1_ = tutorial;
  nVar1 = get_gamedir(SAVE_DIR,(char *)&t);
  if (nVar1 == '\0') {
    curses_raw_print("Could not find where to put the logfile for a new game.");
  }
  else {
    nVar1 = player_selection(&gend,&align,&fd,&local_20,(int)random_player,role._3_1_);
    if (nVar1 != '\0') {
      strncpy(filename + 0x3f8,settings.plname,0x20);
      plname[0x17] = '\0';
      if (ui_flags.playmode == 3) {
        strcpy(filename + 0x3f8,"wizard");
      }
      nh_root_plselection_prompt(nameprompt + 0x78,0x7f,gend,align,fd,local_20);
      snprintf(plname + 0xf8,0x80,"You are a %s.  What is your name?",nameprompt + 0x78);
      while (filename[0x3f8] == '\0') {
        curses_getline(plname + 0xf8,filename + 0x3f8);
        sVar3 = strlen(filename + 0x3f8);
        if (0x1f < sVar3) {
          curses_msgwin("That name is too long.");
          filename[0x3f8] = '\0';
        }
      }
      if (filename[0x3f8] != '\x1b') {
        tVar4 = time((time_t *)0x0);
        snprintf(savedir + 0xf8,0x400,"%s%ld_%s.nhgame",&t,tVar4,filename + 0x3f8);
        __fd = open(savedir + 0xf8,0x242,0x1b0);
        if (__fd == -1) {
          curses_raw_print("Could not create the logfile.");
        }
        else {
          create_game_windows();
          reset_old_status();
          if (role._3_1_ == '\0') {
            local_750 = ui_flags.playmode;
          }
          else {
            local_750 = 1;
          }
          cVar2 = nh_start_game(__fd,filename + 0x3f8,gend,align,fd,local_20,local_750);
          if (cVar2 == '\0') {
            destroy_game_windows();
            close(__fd);
          }
          else {
            load_keymap();
            race = commandloop();
            free_keymap();
            close(__fd);
            destroy_game_windows();
            cleanup_messages();
            game_ended(race,savedir + 0xf8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void rungame(nh_bool tutorial)
{
    int ret, role = initrole, race = initrace, gend = initgend, align = initalign;
    int fd = -1;
    char chardesc[QBUFSZ];
    char nameprompt[QBUFSZ];
    char plname[BUFSZ];
    fnchar filename[1024];
    fnchar savedir[BUFSZ];
    long t;
    
    if (!get_gamedir(SAVE_DIR, savedir)) {
	curses_raw_print("Could not find where to put the logfile for a new game.");
	return;
    }
    
    if (!player_selection(&role, &race, &gend, &align, random_player, tutorial))
	return;
    
    strncpy(plname, settings.plname, PL_NSIZ);
    plname[PL_NSIZ - 1] = 0;
    /* The player name is set to "wizard" (again) in nh_start_game, so setting
     * it here just prevents wizmode player from being asked for a name. */
    if (ui_flags.playmode == MODE_WIZARD)
	strcpy(plname, "wizard");

    nh_root_plselection_prompt(chardesc, QBUFSZ - 1, role, race, gend, align);
    snprintf(nameprompt, QBUFSZ, "You are a %s.  What is your name?", chardesc);
    while (!plname[0]) {
	curses_getline(nameprompt, plname);
	if (strlen(plname) >= PL_NSIZ) {
	    curses_msgwin("That name is too long.");
	    plname[0] = 0;
	}
    }
    if (plname[0] == '\033') /* canceled */
	return;

    t = (long)time(NULL);
#if defined(WIN32)
    _snwprintf(filename, 1024, L"%ls%ld_%hs.nhgame", savedir, t, plname);
    filename[1023] = 0;
#else
    snprintf(filename, 1024, "%s%ld_%s.nhgame", savedir, t, plname);
#endif
    fd = sys_open(filename, O_TRUNC | O_CREAT | O_RDWR, FILE_OPEN_MASK);
    if (fd == -1) {
	curses_raw_print("Could not create the logfile.");
	return;
    }
    
    create_game_windows();
    reset_old_status();
    if (!nh_start_game(fd, plname, role, race, gend, align,
		       tutorial ? MODE_TUTORIAL : ui_flags.playmode)) {
	destroy_game_windows();
	close(fd);
	return;
    }
    
    load_keymap(); /* need to load the keymap after the game has been started */
    ret = commandloop();
    free_keymap();
    close(fd);
    
    destroy_game_windows();
    cleanup_messages();
    game_ended(ret, filename);
}